

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

void Curl_altsvc_cleanup(altsvcinfo **altsvcp)

{
  altsvcinfo *paVar1;
  Curl_llist_node *n;
  undefined8 *puVar2;
  altsvcinfo *altsvc;
  
  paVar1 = *altsvcp;
  if (paVar1 != (altsvcinfo *)0x0) {
    n = Curl_llist_head(&paVar1->list);
    while (n != (Curl_llist_node *)0x0) {
      puVar2 = (undefined8 *)Curl_node_elem(n);
      n = Curl_node_next(n);
      (*Curl_cfree)((void *)*puVar2);
      (*Curl_cfree)((void *)puVar2[2]);
      (*Curl_cfree)(puVar2);
    }
    (*Curl_cfree)(paVar1->filename);
    (*Curl_cfree)(paVar1);
    *altsvcp = (altsvcinfo *)0x0;
  }
  return;
}

Assistant:

void Curl_altsvc_cleanup(struct altsvcinfo **altsvcp)
{
  if(*altsvcp) {
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;
    struct altsvcinfo *altsvc = *altsvcp;
    for(e = Curl_llist_head(&altsvc->list); e; e = n) {
      struct altsvc *as = Curl_node_elem(e);
      n = Curl_node_next(e);
      altsvc_free(as);
    }
    free(altsvc->filename);
    free(altsvc);
    *altsvcp = NULL; /* clear the pointer */
  }
}